

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

void spawn_stdin_stdout(void)

{
  int *piVar1;
  ssize_t sVar2;
  bool bVar3;
  size_t local_428;
  ssize_t c;
  ssize_t w;
  ssize_t r;
  char *pbuf;
  char buf [1024];
  
  do {
    do {
      local_428 = read(0,&pbuf,0x400);
      bVar3 = false;
      if (local_428 == 0xffffffffffffffff) {
        piVar1 = __errno_location();
        bVar3 = *piVar1 == 4;
      }
    } while (bVar3);
    if (local_428 == 0) {
      return;
    }
    if ((long)local_428 < 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
              ,0x75e,"r > 0");
      abort();
    }
    r = (ssize_t)&pbuf;
    for (; local_428 != 0; local_428 = local_428 - sVar2) {
      do {
        sVar2 = write(1,(void *)r,local_428);
        bVar3 = false;
        if (sVar2 == -1) {
          piVar1 = __errno_location();
          bVar3 = *piVar1 == 4;
        }
      } while (bVar3);
      if (sVar2 < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
                ,0x765,"w >= 0");
        abort();
      }
      r = r + sVar2;
    }
  } while( true );
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT(r > 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT(w >= 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}